

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O1

ClauseIterator __thiscall Inferences::CompositeISE::simplifyMany(CompositeISE *this,Clause *cl)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  char cVar3;
  long in_RDX;
  SplitSet *pSVar4;
  
  pSVar4 = (cl->super_Unit)._inference._splits;
  if (pSVar4 != (SplitSet *)0x0 && in_RDX != 0) {
    do {
      (**(code **)(*(long *)pSVar4->_size + 0x28))(this);
      cVar3 = (**(code **)(*(this->super_ImmediateSimplificationEngine).super_InferenceEngine.
                            _vptr_InferenceEngine + 0x10))();
      if (cVar3 != '\0') {
        return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)this;
      }
      pSVar4 = *(SplitSet **)pSVar4->_items;
      pp_Var2 = (this->super_ImmediateSimplificationEngine).super_InferenceEngine.
                _vptr_InferenceEngine;
      if (pp_Var2 != (_func_int **)0x0) {
        pp_Var1 = pp_Var2 + 1;
        *(int *)pp_Var1 = *(int *)pp_Var1 + -1;
        if (*(int *)pp_Var1 == 0) {
          (**(code **)(*pp_Var2 + 8))();
        }
      }
    } while ((in_RDX != 0) && (pSVar4 != (SplitSet *)0x0));
  }
  ::Lib::VirtualIterator<Kernel::Clause_*>::getEmpty();
  return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)this;
}

Assistant:

ClauseIterator CompositeISE::simplifyMany(Clause* cl)
{
  ISList* curr=_innersMany;
  while(curr && cl) {
    ClauseIterator cIt=curr->head()->simplifyMany(cl);
    if(cIt.hasNext()){
      return cIt;
    } else {
      curr=curr->tail();      
    }
  }
  return ClauseIterator::getEmpty();
}